

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

UBool __thiscall icu_63::PluralRules::isKeyword(PluralRules *this,UnicodeString *keyword)

{
  int8_t iVar1;
  RuleChain *pRVar2;
  bool bVar3;
  ConstChar16Ptr local_28;
  char16_t *local_20;
  
  local_28.p_ = (char16_t *)PLURAL_KEYWORD_OTHER;
  iVar1 = UnicodeString::compare(keyword,&local_28,5);
  local_20 = local_28.p_;
  if (iVar1 == '\0') {
    bVar3 = true;
  }
  else {
    pRVar2 = rulesForKeyword(this,keyword);
    bVar3 = pRVar2 != (RuleChain *)0x0;
  }
  return bVar3;
}

Assistant:

UBool
PluralRules::isKeyword(const UnicodeString& keyword) const {
    if (0 == keyword.compare(PLURAL_KEYWORD_OTHER, 5)) {
        return true;
    }
    return rulesForKeyword(keyword) != nullptr;
}